

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O1

int main(void)

{
  uint *puVar1;
  short sVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  long lVar5;
  int64_t offset;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  undefined8 *__dest;
  char *pcVar9;
  char **__s;
  int iVar10;
  int iVar12;
  int iVar13;
  undefined1 auVar11 [16];
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint32_t sparse_bitmap [5];
  CMUnitTest tests [59];
  roaring_add_offset_test_state_t roaring_state [50];
  container_add_offset_test_state_t container_state [9];
  uint32_t dense_bitmap [25005];
  undefined8 auStack_1a0d8 [2];
  undefined4 auStack_1a0c8 [2];
  undefined8 uStack_1a0c0;
  CMUnitTest aCStack_1a0b8 [58];
  long alStack_19798 [4];
  char *pcStack_19778;
  undefined1 *puStack_19770;
  undefined8 auStack_19768 [2];
  undefined8 auStack_19758 [5];
  char *pcStack_19730;
  undefined1 *puStack_19728;
  undefined8 uStack_19720;
  undefined8 uStack_19718;
  char *pcStack_196e8;
  undefined1 *puStack_196e0;
  undefined8 uStack_196d8;
  undefined8 uStack_196d0;
  char *pcStack_196a0;
  undefined1 *puStack_19698;
  undefined8 uStack_19690;
  undefined8 uStack_19688;
  char *pcStack_19658;
  undefined1 *puStack_19650;
  undefined8 uStack_19648;
  undefined8 uStack_19640;
  char *pcStack_19610;
  undefined1 *puStack_19608;
  undefined8 uStack_19600;
  undefined8 uStack_195f8;
  char *pcStack_195c8;
  undefined1 *puStack_195c0;
  undefined8 uStack_195b8;
  undefined8 uStack_195b0;
  char *pcStack_19580;
  undefined1 *puStack_19578;
  undefined8 uStack_19570;
  undefined8 uStack_19568;
  char *pcStack_19538;
  undefined1 *puStack_19530;
  undefined8 uStack_19528;
  undefined8 uStack_19520;
  undefined8 auStack_18968 [82];
  int aiStack_186d8 [25008];
  
  puVar1 = (uint *)cpuid_Version_info(1);
  uVar6 = (ulong)puVar1[3];
  uVar4 = *puVar1 >> 4;
  if (uVar4 < 0x406c) {
    if (uVar4 < 0x2065) {
      if (uVar4 < 0x266) {
        if (uVar4 < 0x6d) {
          uVar6 = (ulong)(uVar4 - 99);
          if (uVar4 - 99 < 2) {
            pcVar9 = "Prescott";
            goto LAB_001029e5;
          }
          if (uVar4 == 0x66) {
            pcVar9 = "Presler";
            goto LAB_001029e5;
          }
        }
        else {
          if (uVar4 == 0x6d) {
            pcVar9 = "Dothan";
            goto LAB_001029e5;
          }
          if (uVar4 == 0x6f) goto switchD_00102792_caseD_0;
          if (uVar4 == 0x16c) {
            pcVar9 = "Pineview";
            goto LAB_001029e5;
          }
        }
      }
      else {
        uVar7 = (ulong)(uVar4 - 0x1066);
        if (uVar4 - 0x1066 < 9) {
          uVar6 = (long)&switchD_00102792::switchdataD_001260a0 +
                  (long)(int)(&switchD_00102792::switchdataD_001260a0)[uVar7];
          switch(uVar7) {
          case 0:
switchD_00102792_caseD_0:
            pcVar9 = "Merom";
            goto LAB_001029e5;
          case 1:
          case 7:
            pcVar9 = "Penryn";
            goto LAB_001029e5;
          case 4:
          case 8:
switchD_00102792_caseD_4:
            pcVar9 = "Nehalem";
            goto LAB_001029e5;
          }
        }
        else {
          uVar6 = uVar7;
          if (uVar4 == 0x266) {
            pcVar9 = "Lincroft";
            goto LAB_001029e5;
          }
          if (uVar4 == 0x366) {
            pcVar9 = "Cedarview";
            goto LAB_001029e5;
          }
        }
      }
    }
    else if (uVar4 < 0x306a) {
      uVar4 = uVar4 - 0x2065;
      if (uVar4 < 0xb) {
        uVar6 = 0x481;
        if ((0x481U >> (uVar4 & 0x1f) & 1) != 0) {
          pcVar9 = "Westmere";
          goto LAB_001029e5;
        }
        uVar6 = 0x120;
        if ((0x120U >> (uVar4 & 0x1f) & 1) != 0) {
          pcVar9 = "SandyBridge";
          goto LAB_001029e5;
        }
        if (uVar4 == 9) goto switchD_00102792_caseD_4;
      }
    }
    else if (uVar4 < 0x306d) {
      if (uVar4 == 0x306a) {
        pcVar9 = "IvyBridge";
        goto LAB_001029e5;
      }
      if (uVar4 == 0x306c) {
        pcVar9 = "Haswell";
        goto LAB_001029e5;
      }
    }
    else {
      if (uVar4 == 0x306d) {
        pcVar9 = "Broadwell";
        goto LAB_001029e5;
      }
      if (uVar4 == 0x30f1) goto LAB_00102978;
    }
  }
  else if (uVar4 < 0x9067) {
    if (uVar4 < 0x706a) {
      if (uVar4 < 0x606a) {
        if (uVar4 == 0x406c) {
          pcVar9 = "CherryTrail";
          goto LAB_001029e5;
        }
        if (uVar4 == 0x506c) goto LAB_00102918;
        if (uVar4 == 0x506e) {
          pcVar9 = "Skylake";
          goto LAB_001029e5;
        }
      }
      else {
        if (uVar4 == 0x606a) {
LAB_00102924:
          pcVar9 = "Icelake";
          goto LAB_001029e5;
        }
        if ((uVar4 == 0x60f0) || (uVar4 == 0x60f8)) {
LAB_00102978:
          pcVar9 = "Zen2";
          goto LAB_001029e5;
        }
      }
    }
    else if (uVar4 < 0x806c) {
      if (uVar4 == 0x706a) {
LAB_00102918:
        pcVar9 = "Goldmont";
        goto LAB_001029e5;
      }
      if (uVar4 == 0x706e) goto LAB_00102924;
      if (uVar4 == 0x70f1) goto LAB_00102978;
    }
    else {
      uVar6 = (ulong)(uVar4 - 0x806c);
      if (uVar4 - 0x806c < 2) {
        pcVar9 = "TigerLake";
        goto LAB_001029e5;
      }
      if (uVar4 == 0x806e) {
LAB_00102988:
        pcVar9 = "Kabylake";
        goto LAB_001029e5;
      }
    }
  }
  else if (uVar4 < 0xa067) {
    if (uVar4 < 0x90f0) {
      if ((uVar4 == 0x9067) || (uVar4 == 0x906a)) {
        pcVar9 = "Alderlake";
        goto LAB_001029e5;
      }
      if (uVar4 == 0x906e) goto LAB_00102988;
    }
    else {
      uVar6 = (ulong)(uVar4 - 0xa065);
      if (uVar4 - 0xa065 < 2) {
        pcVar9 = "Cometlake";
        goto LAB_001029e5;
      }
      if (uVar4 == 0x90f0) goto LAB_00102978;
    }
  }
  else if (uVar4 < 0x40f40) {
    if (uVar4 == 0xa067) {
      pcVar9 = "Rocketlake";
      goto LAB_001029e5;
    }
    if (uVar4 == 0xb067) {
      pcVar9 = "Raptorlake";
      goto LAB_001029e5;
    }
    if (uVar4 == 0x20f10) goto LAB_00102930;
  }
  else {
    if (uVar4 == 0x40f40) {
      pcVar9 = "Zen3+";
      goto LAB_001029e5;
    }
    if (uVar4 == 0x50f00) {
LAB_00102930:
      pcVar9 = "Zen3";
      goto LAB_001029e5;
    }
    if (uVar4 == 0x60f10) {
      pcVar9 = "Zen4";
      goto LAB_001029e5;
    }
  }
  pcVar9 = "unknown";
LAB_001029e5:
  printf("x64 processor:  %s\t",pcVar9,(ulong)puVar1[2],uVar6);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar5 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar5 + 0xc) != '@') {
    lVar5 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar5 + 0xc),(ulong)*(uint *)(lVar5 + 8),
           (ulong)*(uint *)(lVar5 + 0xc));
  }
  auVar3 = _DAT_00126060;
  lVar5 = 0;
  auVar11 = _DAT_00126010;
  auVar15 = _DAT_00126020;
  auVar16 = _DAT_00126030;
  auVar17 = _DAT_00126040;
  do {
    auVar18 = auVar17 ^ auVar3;
    iVar10 = auVar18._0_4_;
    iVar12 = auVar18._8_4_;
    auVar23._4_4_ = iVar10;
    auVar23._0_4_ = iVar10;
    auVar23._8_4_ = iVar12;
    auVar23._12_4_ = iVar12;
    auVar27._0_4_ = -(uint)(iVar10 < -0x7ffffc7c);
    auVar27._4_4_ = -(uint)(iVar10 < -0x7ffffc7c);
    auVar27._8_4_ = -(uint)(iVar12 < -0x7ffffc7c);
    auVar27._12_4_ = -(uint)(iVar12 < -0x7ffffc7c);
    auVar19._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar19._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar19._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar19._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar19 = auVar19 & auVar27;
    auVar18 = pshuflw(auVar23,auVar19,0xe8);
    auVar18 = packssdw(auVar18,auVar18);
    sVar2 = (short)lVar5;
    if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      main::range_100_1000[lVar5] = sVar2 + 100;
    }
    auVar18 = packssdw(auVar19,auVar19);
    auVar18 = packssdw(auVar18,auVar18);
    if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
      main::range_100_1000[lVar5 + 1] = sVar2 + 0x65;
    }
    auVar18 = auVar16 ^ auVar3;
    iVar10 = auVar18._0_4_;
    iVar12 = auVar18._8_4_;
    auVar24._4_4_ = iVar10;
    auVar24._0_4_ = iVar10;
    auVar24._8_4_ = iVar12;
    auVar24._12_4_ = iVar12;
    auVar28._0_4_ = -(uint)(iVar10 < -0x7ffffc7c);
    auVar28._4_4_ = -(uint)(iVar10 < -0x7ffffc7c);
    auVar28._8_4_ = -(uint)(iVar12 < -0x7ffffc7c);
    auVar28._12_4_ = -(uint)(iVar12 < -0x7ffffc7c);
    auVar20._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar20._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar20._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar20._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar20 = auVar20 & auVar28;
    auVar18 = packssdw(auVar24,auVar20);
    auVar18 = packssdw(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      main::range_100_1000[lVar5 + 2] = sVar2 + 0x66;
    }
    auVar18 = pshufhw(auVar20,auVar20,0x84);
    auVar18 = packssdw(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      main::range_100_1000[lVar5 + 3] = sVar2 + 0x67;
    }
    auVar18 = auVar15 ^ auVar3;
    iVar10 = auVar18._0_4_;
    iVar12 = auVar18._8_4_;
    auVar25._4_4_ = iVar10;
    auVar25._0_4_ = iVar10;
    auVar25._8_4_ = iVar12;
    auVar25._12_4_ = iVar12;
    auVar29._0_4_ = -(uint)(iVar10 < -0x7ffffc7c);
    auVar29._4_4_ = -(uint)(iVar10 < -0x7ffffc7c);
    auVar29._8_4_ = -(uint)(iVar12 < -0x7ffffc7c);
    auVar29._12_4_ = -(uint)(iVar12 < -0x7ffffc7c);
    auVar21._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar21._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar21._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar21._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar21 = auVar21 & auVar29;
    auVar18 = pshuflw(auVar25,auVar21,0xe8);
    auVar18 = packssdw(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      main::range_100_1000[lVar5 + 4] = sVar2 + 0x68;
    }
    auVar18 = packssdw(auVar21,auVar21);
    auVar18 = packssdw(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      main::range_100_1000[lVar5 + 5] = sVar2 + 0x69;
    }
    auVar18 = auVar11 ^ auVar3;
    iVar10 = auVar18._0_4_;
    iVar12 = auVar18._8_4_;
    auVar26._4_4_ = iVar10;
    auVar26._0_4_ = iVar10;
    auVar26._8_4_ = iVar12;
    auVar26._12_4_ = iVar12;
    auVar30._0_4_ = -(uint)(iVar10 < -0x7ffffc7c);
    auVar30._4_4_ = -(uint)(iVar10 < -0x7ffffc7c);
    auVar30._8_4_ = -(uint)(iVar12 < -0x7ffffc7c);
    auVar30._12_4_ = -(uint)(iVar12 < -0x7ffffc7c);
    auVar22._0_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar22._4_4_ = -(uint)(auVar18._4_4_ == -0x80000000);
    auVar22._8_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar22._12_4_ = -(uint)(auVar18._12_4_ == -0x80000000);
    auVar22 = auVar22 & auVar30;
    auVar18 = packssdw(auVar26,auVar22);
    auVar18 = packssdw(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      main::range_100_1000[lVar5 + 6] = sVar2 + 0x6a;
    }
    auVar18 = pshufhw(auVar22,auVar22,0x84);
    auVar18 = packssdw(auVar18,auVar18);
    if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      main::range_100_1000[lVar5 + 7] = sVar2 + 0x6b;
    }
    lVar5 = lVar5 + 8;
    lVar8 = auVar17._8_8_;
    auVar17._0_8_ = auVar17._0_8_ + 8;
    auVar17._8_8_ = lVar8 + 8;
    lVar8 = auVar16._8_8_;
    auVar16._0_8_ = auVar16._0_8_ + 8;
    auVar16._8_8_ = lVar8 + 8;
    lVar8 = auVar15._8_8_;
    auVar15._0_8_ = auVar15._0_8_ + 8;
    auVar15._8_8_ = lVar8 + 8;
    lVar8 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 8;
    auVar11._8_8_ = lVar8 + 8;
  } while (lVar5 != 0x388);
  __dest = auStack_18968;
  memcpy(__dest,&PTR_anon_var_dwarf_252_00135b50,0x288);
  auStack_1a0d8[0] = 0x83ba000015cc;
  auStack_1a0d8[1] = 0xdfbc0000abff;
  auStack_1a0c8[0] = 0x14499;
  iVar10 = 100000;
  iVar12 = 0x186a4;
  iVar13 = 0x186a8;
  iVar14 = 0x186ac;
  lVar5 = 3;
  do {
    aiStack_186d8[lVar5] = iVar10;
    aiStack_186d8[lVar5 + 1] = iVar12;
    aiStack_186d8[lVar5 + 2] = iVar13;
    aiStack_186d8[lVar5 + 3] = iVar14;
    iVar10 = iVar10 + 0x10;
    iVar12 = iVar12 + 0x10;
    iVar13 = iVar13 + 0x10;
    iVar14 = iVar14 + 0x10;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x61ab);
  _assert_true(1,"i == ARRAY_SIZE(dense_bitmap)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
               ,0x143);
  __s = &pcStack_19778;
  memset(__s,0,0xe10);
  pcStack_19778 = "roaring_sparse_bitmap_offset_0";
  auStack_19768[0] = 5;
  pcStack_19730 = "roaring_sparse_bitmap_offset_100";
  uStack_19720 = 5;
  uStack_19718 = 100;
  pcStack_196e8 = "roaring_sparse_bitmap_offset_25000";
  uStack_196d8 = 5;
  uStack_196d0 = 25000;
  pcStack_196a0 = "roaring_sparse_bitmap_offset_83097";
  uStack_19690 = 5;
  uStack_19688 = 0x14499;
  pcStack_19658 = "roaring_sparse_bitmap_offset_UINT32_MAX";
  uStack_19648 = 5;
  uStack_19640 = 0xffffffff;
  pcStack_19610 = "roaring_sparse_bitmap_offset_UINT32_MAX - UINT16_MAX";
  uStack_19600 = 5;
  uStack_195f8 = 0xffff0000;
  pcStack_195c8 = "roaring_sparse_bitmap_offset_UINT32_MAX - UINT16_MAX + 1";
  uStack_195b8 = 5;
  uStack_195b0 = 0xffff0001;
  pcStack_19580 = "roaring_sparse_bitmap_offset_((uint64_t)1) << 50";
  uStack_19570 = 5;
  uStack_19568 = 0x4000000000000;
  pcStack_19538 = "roaring_sparse_bitmap_offset_281474976710657L";
  uStack_19528 = 5;
  uStack_19520 = 0x1000000000001;
  lVar5 = 3;
  lVar8 = 0x2a8;
  do {
    *(char **)((long)alStack_19798 + lVar8) = "roaring_dense_bitmap_offset_offset";
    *(int **)((long)alStack_19798 + lVar8 + 8) = aiStack_186d8;
    *(undefined8 *)((long)alStack_19798 + lVar8 + 0x10) = 0x61ad;
    *(long *)((long)alStack_19798 + lVar8 + 0x18) = lVar5;
    lVar5 = lVar5 * 3;
    *(undefined1 (*) [16])((long)&pcStack_19778 + lVar8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)auStack_19768 + lVar8) = (undefined1  [16])0x0;
    *(undefined8 *)((long)auStack_19758 + lVar8) = 0;
    lVar8 = lVar8 + 0x48;
  } while (lVar8 != 0x608);
  lVar5 = 0x400;
  lVar8 = 0x608;
  do {
    *(char **)((long)alStack_19798 + lVar8) = "roaring_dense_bitmap_offset_offset";
    *(int **)((long)alStack_19798 + lVar8 + 8) = aiStack_186d8;
    *(undefined8 *)((long)alStack_19798 + lVar8 + 0x10) = 0x61ad;
    *(long *)((long)alStack_19798 + lVar8 + 0x18) = lVar5;
    lVar5 = lVar5 * 2;
    *(undefined1 (*) [16])((long)&pcStack_19778 + lVar8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)auStack_19768 + lVar8) = (undefined1  [16])0x0;
    *(undefined8 *)((long)auStack_19758 + lVar8) = 0;
    lVar8 = lVar8 + 0x48;
  } while (lVar8 != 0x8d8);
  puStack_19770 = (undefined1 *)auStack_1a0d8;
  puStack_19728 = (undefined1 *)auStack_1a0d8;
  puStack_196e0 = (undefined1 *)auStack_1a0d8;
  puStack_19698 = (undefined1 *)auStack_1a0d8;
  puStack_19650 = (undefined1 *)auStack_1a0d8;
  puStack_19608 = (undefined1 *)auStack_1a0d8;
  puStack_195c0 = (undefined1 *)auStack_1a0d8;
  puStack_19578 = (undefined1 *)auStack_1a0d8;
  puStack_19530 = (undefined1 *)auStack_1a0d8;
  _assert_true(1,"i <= ARRAY_SIZE(roaring_state)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
               ,0x15e);
  memset(aCStack_1a0b8,0,0x938);
  lVar5 = 0x20;
  do {
    *(undefined8 *)((long)auStack_1a0d8 + lVar5) = *__dest;
    *(code **)((long)auStack_1a0c8 + lVar5 + -8) = container_add_offset_test;
    *(code **)((long)auStack_1a0c8 + lVar5) = setup_container_add_offset_test;
    *(code **)((long)&uStack_1a0c0 + lVar5) = teardown_container_add_offset_test;
    *(undefined8 **)((long)&aCStack_1a0b8[0].name + lVar5) = __dest;
    lVar5 = lVar5 + 0x28;
    __dest = __dest + 9;
  } while (lVar5 != 0x188);
  lVar5 = 0x188;
  do {
    *(char **)((long)auStack_1a0d8 + lVar5) = *__s;
    *(code **)((long)auStack_1a0c8 + lVar5 + -8) = roaring_add_offset_test;
    *(code **)((long)auStack_1a0c8 + lVar5) = setup_roaring_add_offset_test;
    *(code **)((long)&uStack_1a0c0 + lVar5) = teardown_roaring_add_offset_test;
    *(char ***)((long)&aCStack_1a0b8[0].name + lVar5) = __s;
    lVar5 = lVar5 + 0x28;
    __s = __s + 9;
  } while (lVar5 != 0x958);
  iVar10 = _cmocka_run_group_tests
                     ("tests",aCStack_1a0b8,0x3b,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar10;
}

Assistant:

int main() {
    tellmeall();

    static uint16_t range_100_1000[900];
    for (uint16_t i = 0, v = 100; i < 900; i++, v++) {
        range_100_1000[i] = v;
    }
    container_add_offset_test_state_t container_state[] = {
        BITSET_ADD_OFFSET_TEST_CASE(range_100_1000, 123),
        BITSET_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX),
        BITSET_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX - 500),
        ARRAY_ADD_OFFSET_TEST_CASE(range_100_1000, 123),
        ARRAY_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX),
        ARRAY_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX - 500),
        RUN_ADD_OFFSET_TEST_CASE(range_100_1000, 123),
        RUN_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX),
        RUN_ADD_OFFSET_TEST_CASE(range_100_1000, UINT16_MAX - 500),
    };

    uint32_t sparse_bitmap[] = {5580, 33722, 44031, 57276, 83097};
    uint32_t dense_bitmap[5 + (200000 - 100000) / 4];
    size_t i, j;

    i = 0;
    dense_bitmap[i++] = 10;
    dense_bitmap[i++] = UINT16_MAX;
    dense_bitmap[i++] = 0x010101;
    for (j = 100000; j < 200000; j += 4) {
        dense_bitmap[i++] = j;
    }
    dense_bitmap[i++] = 400000;
    dense_bitmap[i++] = 1400000;

    assert_true(i == ARRAY_SIZE(dense_bitmap));

    // NB: only add positive offsets, the test function takes care of also
    // running a negative test for that offset.
    roaring_add_offset_test_state_t roaring_state[50] = {
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 0),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 100),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 25000),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 83097),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, UINT32_MAX),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, UINT32_MAX - UINT16_MAX),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap,
                                     UINT32_MAX - UINT16_MAX + 1),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, ((uint64_t)1) << 50),
        ROARING_ADD_OFFSET_TEST_CASE(sparse_bitmap, 281474976710657L),
    };
    i = 9;
    for (int64_t offset = 3; offset < 1000000; offset *= 3) {
        roaring_add_offset_test_state_t state =
            ROARING_ADD_OFFSET_TEST_CASE(dense_bitmap, offset);
        roaring_state[i++] = state;
    }
    for (int64_t offset = 1024; offset < 1000000; offset *= 2) {
        roaring_add_offset_test_state_t state =
            ROARING_ADD_OFFSET_TEST_CASE(dense_bitmap, offset);
        roaring_state[i++] = state;
    }
    assert_true(i <= ARRAY_SIZE(roaring_state));

    i = j = 0;
    struct CMUnitTest
        tests[ARRAY_SIZE(container_state) + ARRAY_SIZE(roaring_state)];
    memset(tests, 0, sizeof(tests));
    for (; i < ARRAY_SIZE(container_state); i++) {
        struct CMUnitTest test = CONTAINER_ADD_OFFSET_TEST(container_state[i]);
        tests[i] = test;
    }
    for (; j < ARRAY_SIZE(roaring_state); i++, j++) {
        struct CMUnitTest test = ROARING_ADD_OFFSET_TEST(roaring_state[j]);
        tests[i] = test;
    }

    return cmocka_run_group_tests(tests, NULL, NULL);
}